

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::render(Plotter *this,View *view)

{
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *this_00;
  pointer *ppPVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  pointer pPVar6;
  pointer pAVar7;
  pointer pEVar8;
  pointer pdVar9;
  iterator __position;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  _Type afVar14;
  undefined8 uVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  uint64_t uVar19;
  pointer pFVar20;
  ASTNode *pAVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  Environment *pEVar26;
  Expr *this_01;
  color *pcVar27;
  pointer pAVar28;
  color *in_R8;
  ulong in_R9;
  pointer pFVar29;
  pointer pEVar30;
  Expr *this_02;
  ulong uVar31;
  long lVar32;
  View *render_view;
  double dVar33;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar34;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar35;
  anon_union_8_3_343d95dd_for_ASTNode_1 extraout_XMM0_Qa;
  double dVar36;
  double dVar37;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined4 uVar41;
  double __tmp;
  undefined4 uVar42;
  undefined1 auVar43 [16];
  float thickness;
  DrawBufferObject obj;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> line;
  color ret;
  double r;
  uint in_stack_fffffffffffffd78;
  Environment *env;
  double local_278;
  double local_258;
  double local_238;
  float local_22c;
  undefined1 local_228 [24];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined1 local_208 [16];
  bool local_1f8;
  uint7 uStack_1f7;
  color *local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_enum_32 local_1b0;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_1a8;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvStack_1a0;
  float local_18c;
  undefined1 local_188 [88];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_enum_32 local_110;
  View *local_108;
  double local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  anon_union_8_3_343d95dd_for_ASTNode_1 local_d8;
  anon_union_8_3_343d95dd_for_ASTNode_1 aStack_d0;
  double *local_c8;
  undefined4 *local_b0;
  double local_a8;
  double local_90;
  undefined1 local_88 [16];
  double local_78;
  double local_70;
  double local_68;
  color local_60;
  
  pcVar2 = local_228 + 0x10;
  local_228._8_8_ = local_228._0_8_;
  local_228._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"x","");
  pEVar26 = &this->env;
  uVar19 = Environment::addr_of(pEVar26,(string *)local_228,false);
  this->x_var = (uint32_t)uVar19;
  if ((pointer)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  local_228._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"y","");
  uVar19 = Environment::addr_of(pEVar26,(string *)local_228,false);
  this->y_var = (uint32_t)uVar19;
  if ((pointer)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  local_228._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"t","");
  uVar19 = Environment::addr_of(pEVar26,(string *)local_228,false);
  this->t_var = (uint32_t)uVar19;
  if ((pointer)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  dVar33 = view->xmin - view->xmax;
  dVar36 = view->ymin - view->ymax;
  bVar5 = this->loss_detail;
  this->loss_detail = false;
  local_1a8 = &this->pt_markers;
  pPVar6 = (this->pt_markers).
           super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    (this->pt_markers).
    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar6;
  }
  local_108 = view;
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::reserve(local_1a8,500);
  this_00 = &this->draw_buf;
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
  _M_erase_at_end(this_00,(this->draw_buf).
                          super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  pFVar29 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar20 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  env = pEVar26;
  if ((long)pFVar20 - (long)pFVar29 != 0) {
    uVar24 = ((long)pFVar20 - (long)pFVar29 >> 4) * -0x79435e50d79435e5;
    uVar31 = 0;
    do {
      if ((pFVar29[uVar31].type & 0xfffffff0U) == 0) {
        pAVar28 = pFVar29[uVar31].expr.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        in_R8 = (color *)((long)pFVar29[uVar31].expr.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar28);
        if (in_R8 != (color *)0x0) {
          in_R8 = (color *)(((long)in_R8 >> 4) + (ulong)((long)in_R8 >> 4 == 0));
          do {
            if (pAVar28->opcode == 0xc) {
              if (uVar24 <= this->max_functions_find_crit_points) {
                uVar24 = (ulong)(&this->x_var)[(pFVar29[uVar31].type & 0xfffffff8U) == 8];
                Expr::diff((Expr *)local_228,&pFVar29[uVar31].expr,uVar24,pEVar26);
                pAVar28 = pFVar29[uVar31].diff.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pAVar7 = pFVar29[uVar31].diff.ast.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pFVar29[uVar31].diff.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
                pFVar29[uVar31].diff.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
                pFVar29[uVar31].diff.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
                local_228._0_16_ = ZEXT816(0);
                local_228._16_8_ = (pointer)0x0;
                pEVar26 = env;
                if (pAVar28 != (pointer)0x0) {
                  operator_delete(pAVar28,(long)pAVar7 - (long)pAVar28);
                  pEVar26 = env;
                  if ((pointer)local_228._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
                    pEVar26 = env;
                  }
                }
                bVar16 = Expr::is_null(&pFVar29[uVar31].diff);
                if (bVar16) {
                  Expr::ASTNode::ASTNode((ASTNode *)local_228,null);
                  pAVar28 = pFVar29[uVar31].ddiff.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(undefined8 *)pAVar28 = local_228._0_8_;
                  (pAVar28->field_1).ref = local_228._8_8_;
                  env = pEVar26;
                }
                else {
                  env = pEVar26;
                  Expr::diff((Expr *)local_228,&pFVar29[uVar31].diff,uVar24,pEVar26);
                  pAVar28 = pFVar29[uVar31].ddiff.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pAVar7 = pFVar29[uVar31].ddiff.ast.
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pFVar29[uVar31].ddiff.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
                  pFVar29[uVar31].ddiff.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
                  pFVar29[uVar31].ddiff.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
                  local_228._0_16_ = ZEXT816(0);
                  local_228._16_8_ = (pointer)0x0;
                  if (pAVar28 != (pointer)0x0) {
                    operator_delete(pAVar28,(long)pAVar7 - (long)pAVar28);
                    if ((pointer)local_228._0_8_ != (pointer)0x0) {
                      operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
                    }
                  }
                }
                Expr::diff((Expr *)local_228,&pFVar29[uVar31].recip,uVar24,pEVar26);
                pAVar28 = pFVar29[uVar31].drecip.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pAVar7 = pFVar29[uVar31].drecip.ast.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pFVar29[uVar31].drecip.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
                pFVar29[uVar31].drecip.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
                pFVar29[uVar31].drecip.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
                local_228._0_16_ = ZEXT816(0);
                local_228._16_8_ = (pointer)0x0;
                if (pAVar28 != (pointer)0x0) {
                  operator_delete(pAVar28,(long)pAVar7 - (long)pAVar28);
                  if ((pointer)local_228._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
                  }
                }
                pFVar29 = (this->funcs).
                          super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pFVar20 = (this->funcs).
                          super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              break;
            }
            pAVar28 = pAVar28 + 1;
            in_R8 = (color *)((long)&in_R8[-1].a + 7);
          } while (in_R8 != (color *)0x0);
        }
      }
      uVar31 = uVar31 + 1;
      uVar24 = ((long)pFVar20 - (long)pFVar29 >> 4) * -0x79435e50d79435e5;
    } while (uVar31 < uVar24);
  }
  if (pFVar20 != pFVar29) {
    local_78 = SQRT(dVar33 * dVar33 + dVar36 * dVar36) * 0.01;
    pcVar27 = (color *)0x0;
    render_view = local_108;
    do {
      if ((pFVar29[(long)pcVar27].type & 0xfffffff8U) == 0x80) {
        pEVar30 = pFVar29[(long)pcVar27].exprs.
                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar8 = pFVar29[(long)pcVar27].exprs.
                 super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pEVar8 != pEVar30) && (((uint)((int)pEVar8 - (int)pEVar30) >> 3 & 1) == 0)) {
          fVar40 = 0.0;
          local_188._0_4_ = 0.0;
          local_188._4_4_ = 0.0;
          local_188._8_8_ = (array<double,_2UL> *)0x0;
          local_188._16_8_ = (pointer)0x0;
          pEVar30 = pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pFVar29[(long)pcVar27].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_finish != pEVar30) {
            lVar32 = 0x18;
            uVar24 = 0;
            do {
              this_01 = (Expr *)((long)&pEVar30[-1].ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar32);
              local_208._0_4_ = -NAN;
              local_208._4_4_ = -NAN;
              local_208._8_4_ = -NAN;
              local_208._12_4_ = -NAN;
              bVar16 = Expr::is_ref(this_01);
              pEVar26 = env;
              if (bVar16) {
                pAVar21 = Expr::operator[](this_01,0);
                uVar19 = (pAVar21->field_1).ref;
                local_208._0_4_ = (undefined4)uVar19;
                local_208._4_4_ = (undefined4)(uVar19 >> 0x20);
                pdVar9 = (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pEVar26 = env;
                if (NAN(pdVar9[uVar19])) {
                  pdVar9[uVar19] = 1.0;
                }
              }
              this_02 = (Expr *)((long)&(pEVar30->ast).
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar32);
              bVar16 = Expr::is_ref(this_02);
              if (bVar16) {
                pAVar21 = Expr::operator[](this_02,0);
                uVar19 = (pAVar21->field_1).ref;
                local_208._8_4_ = (undefined4)uVar19;
                local_208._12_4_ = (undefined4)(uVar19 >> 0x20);
                pdVar9 = (pEVar26->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                if (NAN(pdVar9[uVar19])) {
                  pdVar9[uVar19] = 1.0;
                }
              }
              env = pEVar26;
              aVar34.val = Expr::operator()(this_01,pEVar26);
              aVar35.val = Expr::operator()(this_02,pEVar26);
              if ((ABS(aVar35.val) != INFINITY && ABS(aVar34.val) != INFINITY) &&
                  (!NAN(aVar34.val) && !NAN(aVar35.val))) {
                local_d8.val = aVar34.val;
                aStack_d0.val = aVar35.val;
                if (local_188._8_8_ == local_188._16_8_) {
                  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
                  _M_realloc_insert<std::array<double,2ul>>
                            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>
                              *)local_188,(iterator)local_188._8_8_,(array<double,_2UL> *)&local_d8)
                  ;
                }
                else {
                  *(double *)local_188._8_8_ = (double)aVar34;
                  ((anon_union_8_3_343d95dd_for_ASTNode_1 *)((double *)local_188._8_8_ + 1))->val =
                       (double)aVar35;
                  local_188._8_8_ = local_188._8_8_ + 0x10;
                }
                local_228._16_8_ = local_228._16_8_ & 0xffffffff00000000;
                local_228._8_8_ = aVar35.ref;
                local_228._0_8_ = aVar34.ref;
                local_1f8 = false;
                __position._M_current =
                     (this->pt_markers).
                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                _uStack_210 = pcVar27;
                if (__position._M_current ==
                    (this->pt_markers).
                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  _M_realloc_insert<nivalis::PointMarker>
                            (local_1a8,__position,(PointMarker *)local_228);
                  aVar35 = extraout_XMM0_Qa;
                }
                else {
                  *(ulong *)&(__position._M_current)->passive = (ulong)uStack_1f7 << 8;
                  uVar13 = local_208._4_4_;
                  uVar12 = local_208._0_4_;
                  auVar39._0_8_ = CONCAT44(uVar13,uVar12);
                  auVar39._8_4_ = local_208._8_4_;
                  auVar39._12_4_ = local_208._12_4_;
                  (__position._M_current)->drag_var_x = auVar39._0_8_;
                  (__position._M_current)->drag_var_y = auVar39._8_8_;
                  *(undefined8 *)&(__position._M_current)->label = local_228._16_8_;
                  (__position._M_current)->rel_func = (size_t)pcVar27;
                  (__position._M_current)->x = (double)aVar34;
                  (__position._M_current)->y = (double)aVar35;
                  ppPVar1 = &(this->pt_markers).
                             super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppPVar1 = *ppPVar1 + 1;
                  aVar35.val = aVar34.val;
                }
              }
              fVar40 = aVar35.call_info[0];
              uVar24 = uVar24 + 2;
              pEVar30 = pFVar29[(long)pcVar27].exprs.
                        super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar32 = lVar32 + 0x30;
            } while (uVar24 < (ulong)(((long)pFVar29[(long)pcVar27].exprs.
                                             super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pEVar30 >> 3) * -0x5555555555555555));
          }
          uVar25 = pFVar29[(long)pcVar27].type;
          in_R8 = (color *)(ulong)(uVar25 & 1);
          bVar16 = (uVar25 & 4) == 0;
          in_R9 = (ulong)bVar16;
          in_stack_fffffffffffffd78 = (uVar25 & 2) >> 1;
          anon_unknown_1::buf_add_polyline
                    (this_00,(View *)local_188,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &pFVar29[(long)pcVar27].line_color,pcVar27,(size_t)in_R8,fVar40,bVar16,
                     SUB41(in_stack_fffffffffffffd78,0),SUB81(env,0));
          render_view = local_108;
          if ((_Type)local_188._0_8_ != (_Type)0x0) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
          }
          pFVar29 = (this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar20 = (this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      pcVar27 = (color *)((long)pcVar27->data + 1);
    } while (pcVar27 < (color *)(((long)pFVar20 - (long)pFVar29 >> 4) * -0x79435e50d79435e5));
    if (pFVar20 != pFVar29) {
      pcVar27 = (color *)0x0;
      do {
        switch((uint)pFVar29[(long)pcVar27].type >> 3) {
        case 0:
          bVar16 = false;
          goto LAB_00140057;
        case 1:
          bVar16 = true;
LAB_00140057:
          plot_explicit(this,(size_t)pcVar27,bVar16);
          break;
        case 2:
          plot_implicit(this,(size_t)pcVar27);
          break;
        case 3:
          local_188._0_4_ = 0.0;
          local_188._4_4_ = 0.0;
          local_188._8_8_ = (array<double,_2UL> *)0x0;
          local_188._16_8_ = (pointer)0x0;
          local_c8 = (double *)0x0;
          local_d8.ref = 0;
          aStack_d0.ref = 0;
          local_238 = (double)pFVar29[(long)pcVar27].tmin;
          dVar36 = (double)pFVar29[(long)pcVar27].tmax;
          local_278 = dVar36;
          if (pFVar29[(long)pcVar27].tmin <= pFVar29[(long)pcVar27].tmax) {
            local_278 = local_238;
            local_238 = dVar36;
          }
          uVar25 = pFVar29[(long)pcVar27].type;
          if ((uVar25 & 1) != 0) {
            dVar36 = (local_238 - local_278) / 0.0031415926535897933 + 1.0;
            uVar24 = (ulong)dVar36;
            std::vector<double,_std::allocator<double>_>::reserve
                      ((vector<double,_std::allocator<double>_> *)&local_d8,
                       (long)(dVar36 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24);
          }
          if ((uVar25 & 2) == 0) {
            dVar36 = (local_238 - local_278) / 0.0031415926535897933 + 1.0;
            uVar24 = (ulong)dVar36;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_188,
                       (long)(dVar36 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24);
          }
          if (local_278 <= local_238) {
            dVar36 = local_278;
            do {
              (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->t_var] = dVar36;
              local_60.data._0_8_ = Expr::operator()(&pFVar29[(long)pcVar27].expr,env);
              if ((uVar25 & 1) != 0) {
                if ((double *)aStack_d0.ref == local_c8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_d8,(iterator)aStack_d0,
                             (double *)&local_60);
                }
                else {
                  *(undefined8 *)aStack_d0 = local_60.data._0_8_;
                  aStack_d0.ref = aStack_d0.ref + 8;
                }
              }
              if ((uVar25 & 2) == 0) {
                local_1a8 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                            local_60.data._0_8_;
                pvStack_1a0 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *
                              )0x0;
                local_a8 = cos(dVar36);
                pvStack_1a0 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *
                              )local_60.data._0_8_;
                dVar33 = sin(dVar36);
                local_228._8_4_ = SUB84(dVar33 * (double)pvStack_1a0,0);
                local_228._0_8_ = local_a8 * (double)local_1a8;
                local_228._12_4_ = (int)((ulong)(dVar33 * (double)pvStack_1a0) >> 0x20);
                if (local_188._8_8_ == local_188._16_8_) {
                  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
                  _M_realloc_insert<std::array<double,2ul>>
                            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>
                              *)local_188,(iterator)local_188._8_8_,(array<double,_2UL> *)local_228)
                  ;
                }
                else {
                  *(double *)local_188._8_8_ = local_a8 * (double)local_1a8;
                  ((anon_union_8_3_343d95dd_for_ASTNode_1 *)((double *)local_188._8_8_ + 1))->ref =
                       local_228._8_8_;
                  local_188._8_8_ = local_188._8_8_ + 0x10;
                }
              }
              dVar36 = dVar36 + 0.0031415926535897933;
            } while (dVar36 <= local_238);
          }
          if ((uVar25 & 2) == 0) {
            in_stack_fffffffffffffd78 = 0;
            in_R8 = (color *)0x0;
            in_R9 = 1;
            anon_unknown_1::buf_add_polyline
                      (this_00,(View *)local_188,
                       (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )&pFVar29[(long)pcVar27].line_color,pcVar27,0,SUB84(local_238,0),true,false,
                       SUB81(env,0));
          }
          if ((uVar25 & 1) != 0) {
            dVar36 = fmod(local_278,6.283185307179586);
            dVar33 = fmod(local_238,6.283185307179586);
            iVar18 = render_view->shigh;
            if (0 < iVar18) {
              thickness = 0.0;
              local_90 = local_278 -
                         (double)(~-(ulong)(dVar36 < 0.0) & (ulong)dVar36 |
                                 (ulong)(dVar36 + 6.283185307179586) & -(ulong)(dVar36 < 0.0));
              fVar40 = (float)iVar18;
              dVar36 = (double)(~-(ulong)(dVar33 < 0.0) & (ulong)dVar33 |
                               (ulong)(dVar33 + 6.283185307179586) & -(ulong)(dVar33 < 0.0));
              local_1a8 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                          ((double)(~-(ulong)(dVar36 == 0.0) & (ulong)(6.283185307179586 - dVar36))
                           + local_238 + local_238);
              pvStack_1a0 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                            0x0;
              iVar23 = render_view->swid;
              local_22c = 0.0;
              do {
                if (0 < iVar23) {
                  local_68 = ((render_view->ymax - render_view->ymin) * (double)(fVar40 - local_22c)
                             ) / (double)iVar18 + render_view->ymin;
                  local_70 = local_68 * local_68;
                  fVar40 = 0.0;
                  do {
                    dVar36 = ((render_view->xmax - render_view->xmin) * (double)fVar40) /
                             (double)iVar23 + render_view->xmin;
                    local_18c = fVar40;
                    dVar33 = atan2(local_68,dVar36);
                    aVar35 = local_d8;
                    if (local_90 <= (double)local_1a8) {
                      local_100 = SQRT(dVar36 * dVar36 + local_70);
                      auVar43._0_8_ = ~-(ulong)(dVar33 < 0.0) & (ulong)dVar33;
                      auVar43._8_8_ = 0;
                      auVar10._8_4_ = (int)extraout_XMM0_Qb;
                      auVar10._0_8_ = (ulong)(dVar33 + 6.283185307179586) & -(ulong)(dVar33 < 0.0);
                      auVar10._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
                      auVar43 = auVar43 | auVar10;
                      uVar24 = ((long)(aStack_d0.ref - (long)local_d8) >> 3) - 1;
                      local_258 = 0.0;
                      dVar36 = local_90;
                      local_88 = auVar43;
                      do {
                        dVar37 = auVar43._0_8_ + dVar36;
                        dVar33 = local_258;
                        if ((local_278 <= dVar37) && (dVar37 <= local_238)) {
                          local_a8 = dVar36;
                          dVar36 = round((dVar37 - local_278) / 0.0031415926535897933);
                          uVar41 = 0;
                          uVar42 = 0;
                          if (0.0 <= dVar36) {
                            uVar41 = SUB84(dVar36,0);
                            uVar42 = (undefined4)((ulong)dVar36 >> 0x20);
                          }
                          uVar22 = (long)((double)CONCAT44(uVar42,uVar41) - 9.223372036854776e+18) &
                                   (long)(double)CONCAT44(uVar42,uVar41) >> 0x3f |
                                   (long)(double)CONCAT44(uVar42,uVar41);
                          uVar31 = uVar24;
                          if (uVar22 <= uVar24) {
                            uVar31 = uVar22;
                          }
                          auVar43 = local_88;
                          dVar36 = local_a8;
                          dVar33 = local_258 * 0.75 + 0.25;
                          if (((uVar25 & 4) == 0) ==
                              local_100 < *(double *)(aVar35.ref + uVar31 * 8)) {
                            dVar33 = local_258;
                          }
                        }
                        local_258 = dVar33;
                        render_view = local_108;
                        dVar36 = dVar36 + 6.283185307179586;
                      } while (dVar36 <= (double)local_1a8);
                      if (0.0 < local_258) {
                        color::color::color((color *)local_228,&pFVar29[(long)pcVar27].line_color);
                        *(float *)CONCAT44(local_208._12_4_,local_208._8_4_) = (float)local_258;
                        anon_unknown_1::buf_add_screen_rectangle
                                  (this_00,render_view,local_18c,local_22c,1.5,1.5,
                                   SUB81((color *)local_228,0),pcVar27,thickness,(size_t)in_R8);
                      }
                    }
                    iVar23 = render_view->swid;
                    fVar40 = local_18c + 1.5;
                  } while (fVar40 < (float)iVar23);
                  iVar18 = render_view->shigh;
                }
                fVar40 = (float)iVar18;
                local_22c = local_22c + 1.5;
              } while (local_22c < fVar40);
            }
          }
          afVar14 = (_Type)local_188._0_8_;
          pAVar28 = (pointer)local_188._16_8_;
          if ((double *)local_d8.ref != (double *)0x0) {
            operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
            afVar14 = (_Type)local_188._0_8_;
            pAVar28 = (pointer)local_188._16_8_;
          }
joined_r0x001401f7:
          if (afVar14 != (_Type)0x0) {
            operator_delete((void *)afVar14,(long)pAVar28 - (long)afVar14);
          }
          break;
        case 5:
          if ((long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x30) {
            local_228._0_16_ = ZEXT816(0);
            local_228._16_8_ = (pointer)0x0;
            dVar36 = (double)pFVar29[(long)pcVar27].tmin;
            dVar37 = (double)pFVar29[(long)pcVar27].tmax;
            dVar33 = dVar37;
            if (pFVar29[(long)pcVar27].tmin <= pFVar29[(long)pcVar27].tmax) {
              dVar33 = dVar36;
              dVar36 = dVar37;
            }
            dVar37 = (dVar36 - dVar33) / 10000.0;
            pEVar26 = env;
            if (dVar33 <= dVar36) {
              local_100 = 1e-12;
              if (1e-12 <= dVar37) {
                local_100 = dVar37;
              }
              local_88._0_8_ = &pFVar29[(long)pcVar27].line_color;
              local_a8 = dVar33;
              do {
                dVar37 = local_e8;
                local_1a8 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                            CONCAT44(local_f8._4_4_,(undefined4)local_f8);
                (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->t_var] = dVar33;
                local_e8 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                            super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                            ._M_impl.super__Vector_impl_data._M_start,env);
                uStack_e0 = extraout_XMM0_Qb_00;
                local_f8 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                            super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1,env);
                uStack_f0 = extraout_XMM0_Qb_01;
                if ((local_a8 < dVar33) &&
                   (dVar37 = (local_e8 - dVar37) * (local_e8 - dVar37) +
                             (local_f8 - (double)local_1a8) * (local_f8 - (double)local_1a8),
                   local_78 < dVar37)) {
                  anon_unknown_1::buf_add_screen_polyline
                            (this_00,render_view,
                             (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              *)local_228,(color *)local_88._0_8_,(size_t)pcVar27,SUB84(dVar37,0),
                             SUB81(in_R9,0),SUB41(in_stack_fffffffffffffd78,0),SUB81(pEVar26,0));
                  if (local_228._8_8_ != local_228._0_8_) {
                    local_228._8_8_ = local_228._0_8_;
                  }
                }
                uVar3 = render_view->swid;
                uVar4 = render_view->shigh;
                auVar38._0_8_ = (double)(int)uVar3 * (local_e8 - render_view->xmin);
                auVar38._8_8_ = (double)(int)uVar4 * (render_view->ymax - local_f8);
                dVar37 = render_view->ymax - render_view->ymin;
                auVar11._8_4_ = SUB84(dVar37,0);
                auVar11._0_8_ = render_view->xmax - render_view->xmin;
                auVar11._12_4_ = (int)((ulong)dVar37 >> 0x20);
                auVar39 = divpd(auVar38,auVar11);
                local_188._0_4_ = (undefined4)auVar39._0_8_;
                local_188._4_4_ = (undefined4)auVar39._8_8_;
                std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
                emplace_back<std::array<float,2ul>>
                          ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                           local_228,(array<float,_2UL> *)local_188);
                dVar33 = dVar33 + local_100;
              } while (dVar33 <= dVar36);
            }
            else {
            }
            in_R8 = pcVar27;
            anon_unknown_1::buf_add_screen_polyline
                      (this_00,render_view,
                       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_228,&pFVar29[(long)pcVar27].line_color,(size_t)pcVar27,(float)local_e8,
                       SUB81(in_R9,0),SUB41(in_stack_fffffffffffffd78,0),SUB81(pEVar26,0));
            env = pEVar26;
            if ((pointer)local_228._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
              env = pEVar26;
            }
          }
          break;
        case 0x11:
          if ((long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x60) {
            local_228._0_16_ = ZEXT816(0);
            local_228._16_8_ = (pointer)0x0;
            color::color::color((color *)local_208);
            local_1d0._M_p = (pointer)&local_1c0;
            local_1c8 = 0;
            local_1c0._M_local_buf[0] = '\0';
            local_1d8 = pcVar27;
            color::color::operator=
                      ((color *)local_188,(color *)local_208,&pFVar29[(long)pcVar27].line_color);
            uStack_210 = 0x40000000;
            local_1b0 = RECT;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_228,2);
            uVar15 = local_228._0_8_;
            dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start,env);
            *(double *)uVar15 = dVar36;
            dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,env);
            *(double *)(uVar15 + 8) = dVar36;
            dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 2,env);
            *(double *)(uVar15 + 0x10) = dVar36;
            dVar33 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 3,env);
            *(double *)(uVar15 + 0x18) = dVar33;
            dVar36 = *(double *)uVar15;
            if (*(double *)(uVar15 + 0x10) < dVar36) {
              *(double *)uVar15 = *(double *)(uVar15 + 0x10);
              *(double *)(uVar15 + 0x10) = dVar36;
            }
            dVar36 = *(double *)(uVar15 + 8);
            if (dVar33 < dVar36) {
              *(double *)(uVar15 + 8) = dVar33;
              *(double *)(uVar15 + 0x18) = dVar36;
            }
            uVar25 = pFVar29[(long)pcVar27].type;
            if ((uVar25 & 2) != 0) {
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_188,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_228);
              local_188._24_4_ = uStack_210;
              color::color::color((color *)(local_188 + 0x20),(color *)local_208);
              local_188._80_8_ = local_1d8;
              local_130._M_p = (pointer)&local_120;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,local_1d0._M_p,local_1d0._M_p + local_1c8);
              local_110 = FILLED_RECT;
              color::color::color((color *)&local_d8,&pFVar29[(long)pcVar27].line_color);
              *local_b0 = 0x3e800000;
              color::color::operator=(&local_60,(color *)(local_188 + 0x20),(color *)&local_d8);
              std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              emplace_back<nivalis::DrawBufferObject>(this_00,(DrawBufferObject *)local_188);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_p != &local_120) {
                operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
              }
              if ((_Type)local_188._0_8_ != (_Type)0x0) {
                operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
              }
              uVar25 = pFVar29[(long)pcVar27].type;
            }
            if ((uVar25 & 4) == 0) {
              std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              emplace_back<nivalis::DrawBufferObject>(this_00,(DrawBufferObject *)local_228);
            }
LAB_001401ca:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_p != &local_1c0) {
              operator_delete(local_1d0._M_p,
                              CONCAT71(local_1c0._M_allocated_capacity._1_7_,
                                       local_1c0._M_local_buf[0]) + 1);
            }
            afVar14 = (_Type)local_228._0_8_;
            pAVar28 = (pointer)local_228._16_8_;
            goto joined_r0x001401f7;
          }
          break;
        case 0x12:
        case 0x13:
          uVar25 = pFVar29[(long)pcVar27].type & 0xfffffff8;
          if (((long)pFVar29[(long)pcVar27].exprs.
                     super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)pFVar29[(long)pcVar27].exprs.
                     super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
              ((ulong)(uVar25 == 0x98) + 3) == 0) {
            local_228._0_16_ = ZEXT816(0);
            local_228._16_8_ = (pointer)0x0;
            color::color::color((color *)local_208);
            local_1d0._M_p = (pointer)&local_1c0;
            local_1c8 = 0;
            local_1c0._M_local_buf[0] = '\0';
            local_1d8 = pcVar27;
            color::color::operator=
                      ((color *)local_188,(color *)local_208,&pFVar29[(long)pcVar27].line_color);
            uStack_210 = 0x40000000;
            local_1b0 = (uVar25 == 0x98) + 7 + (uint)(uVar25 == 0x98);
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_228,2);
            uVar15 = local_228._0_8_;
            dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start,env);
            *(double *)uVar15 = dVar36;
            dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,env);
            *(double *)(uVar15 + 8) = dVar36;
            dVar36 = *(double *)uVar15;
            dVar33 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 2,env);
            *(double *)(uVar15 + 0x10) = dVar36 + dVar33;
            *(double *)(uVar15 + 0x18) = *(double *)(uVar15 + 8);
            if (uVar25 == 0x98) {
              dVar36 = Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                        super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 3,env);
              *(double *)(uVar15 + 0x18) = dVar36 + *(double *)(uVar15 + 0x18);
            }
            uVar17 = pFVar29[(long)pcVar27].type;
            if ((uVar17 & 2) != 0) {
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_188,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_228);
              local_188._24_4_ = uStack_210;
              color::color::color((color *)(local_188 + 0x20),(color *)local_208);
              local_188._80_8_ = local_1d8;
              local_130._M_p = (pointer)&local_120;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,local_1d0._M_p,local_1d0._M_p + local_1c8);
              local_110 = (uVar25 == 0x98) + 8 + (uint)(uVar25 == 0x98);
              color::color::color((color *)&local_d8,&pFVar29[(long)pcVar27].line_color);
              *local_b0 = 0x3e800000;
              color::color::operator=(&local_60,(color *)(local_188 + 0x20),(color *)&local_d8);
              std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              emplace_back<nivalis::DrawBufferObject>(this_00,(DrawBufferObject *)local_188);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_p != &local_120) {
                operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
              }
              if ((_Type)local_188._0_8_ != (_Type)0x0) {
                operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
              }
              uVar17 = pFVar29[(long)pcVar27].type;
            }
            if ((uVar17 & 4) == 0) {
              std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              emplace_back<nivalis::DrawBufferObject>(this_00,(DrawBufferObject *)local_228);
            }
            goto LAB_001401ca;
          }
          break;
        case 0x14:
          if ((long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pFVar29[(long)pcVar27].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x30) {
            local_228._0_16_ = ZEXT816(0);
            local_228._16_8_ = (pointer)0x0;
            color::color::color((color *)local_208);
            local_1d0._M_p = (pointer)&local_1c0;
            local_1c8 = 0;
            local_1c0._M_local_buf[0] = '\0';
            pEVar26 = env;
            local_1d8 = pcVar27;
            color::color::operator=
                      ((color *)local_188,(color *)local_208,&pFVar29[(long)pcVar27].line_color);
            local_1b0 = TEXT;
            local_188._0_8_ =
                 Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                  _M_impl.super__Vector_impl_data._M_start,env);
            local_188._8_8_ =
                 Expr::operator()(pFVar29[(long)pcVar27].exprs.
                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1,env);
            std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
            _M_assign_aux<std::array<double,2ul>const*>
                      ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                       local_228,local_188,local_188 + 0x10);
            std::__cxx11::string::_M_assign((string *)&local_1d0);
            std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
            emplace_back<nivalis::DrawBufferObject>(this_00,(DrawBufferObject *)local_228);
            env = pEVar26;
            goto LAB_001401ca;
          }
        }
        pcVar27 = (color *)((long)pcVar27->data + 1);
        pFVar29 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (pcVar27 < (color *)(((long)(this->funcs).
                                          super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29
                                   >> 4) * -0x79435e50d79435e5));
    }
  }
  if (this->loss_detail == false) {
    if (bVar5 != false) {
      (this->func_error)._M_string_length = 0;
      *(this->func_error)._M_dataplus._M_p = '\0';
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->func_error,0,(char *)(this->func_error)._M_string_length,0x21d0b2);
  }
  return;
}

Assistant:

void Plotter::render(const View& view) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    // * Constants
    // Number of different t values to evaluate for a parametric equation
    static const double PARAMETRIC_STEPS = 1e4;
    // Number of different t values to evaluate for a polar function
    static const double POLAR_STEP_SIZE = M_PI * 1e-3;
    // If parametric function moves more than this amount (square of l2),
    // disconnects the function line
    const double PARAMETRIC_DISCONN_THRESH = 1e-2 *
        std::sqrt(util::sqr_dist(view.xmin, view.ymin, view.xmax, view.ymax));

    bool prev_loss_detail = loss_detail;
    loss_detail = false; // Will set to show 'some detail may be lost'

    // * Clear back buffers
    pt_markers.clear(); pt_markers.reserve(500);
    draw_buf.clear();

    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            bool has_call = false;
            for (size_t i = 0 ; i < funcs[funcid].expr.ast.size(); ++i) {
                if (funcs[funcid].expr.ast[i].opcode == OpCode::call) {
                    has_call = true;
                    break;
                }
            }
            if (has_call && funcs.size() <= max_functions_find_crit_points) {
                // Re-compute derivatives, if explicit and has
                // at least one user-function call
                // This is needed since the user function may have been changed
                if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                        ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
                    uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
                    func.diff = func.expr.diff(var, env);
                    if (!func.diff.is_null()) {
                        func.ddiff = func.diff.diff(var, env);
                    }
                    else func.ddiff.ast[0] = OpCode::null;
                    func.drecip = func.recip.diff(var, env);
                }
            }
        }
    }

    // * Draw functions
    // BEGIN_PROFILE;
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        if ((func.type & ~Function::FUNC_TYPE_MOD_ALL) ==
                Function::FUNC_TYPE_GEOM_POLYLINE) {
            // Draw polyline
            // Do this first since it can affect other functions in the same frame
            // e.g (p, q) moved
            if (func.exprs.size() && (func.exprs.size() & 1) == 0) {
                std::vector<std::array<double, 2> > line;
                double mark_radius = MARKER_DISP_RADIUS - 1;
                for (size_t i = 0; i < func.exprs.size(); i += 2) {
                    PointMarker ptm;
                    auto& expr_x = func.exprs[i],
                    & expr_y = func.exprs[i+1];
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    if (expr_x.is_ref()) {
                        ptm.drag_var_x = expr_x[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_x])) {
                            env.vars[ptm.drag_var_x] = 1.;
                        }
                    }
                    if (expr_y.is_ref()) {
                        ptm.drag_var_y = expr_y[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_y])) {
                            env.vars[ptm.drag_var_y] = 1.;
                        }
                    }
                    double x = expr_x(env), y = expr_y(env);
                    if (std::isnan(x) || std::isnan(y) ||
                            std::isinf(x) || std::isinf(y)) {
                        continue;
                    }
                    line.push_back({x, y});
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.y = y; ptm.x = x;
                    ptm.passive = false;
                    ptm.rel_func = funcid;
                    pt_markers.push_back(std::move(ptm));
                }
                buf_add_polyline(draw_buf, view, line, func.line_color,
                        funcid, 2.f,
                        func.type & Function::FUNC_TYPE_MOD_CLOSED,
                        (func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0,
                        func.type & Function::FUNC_TYPE_MOD_FILLED);
            }
        }
    }
    // Draw all other functions
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        switch (ftype_nomod) {
            case Function::FUNC_TYPE_IMPLICIT:
                plot_implicit(funcid); break;
            case Function::FUNC_TYPE_PARAMETRIC:
                {
                    if (func.exprs.size() != 2) continue;
                    std::vector<std::array<float, 2> > curr_line;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    double tstep = std::max((tmax - tmin) / PARAMETRIC_STEPS, 1e-12);
                    double px, py;
                    for (double t = tmin; t <= tmax; t += tstep) {
                        env.vars[t_var] = t;
                        double x = func.exprs[0](env),
                               y = func.exprs[1](env);
                        if (t > tmin && util::sqr_dist(x, y, px, py) > PARAMETRIC_DISCONN_THRESH) {
                            buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                            curr_line.clear();
                        }
                        float sx = _X_TO_SX(x), sy = _Y_TO_SY(y);
                        curr_line.push_back({sx, sy});
                        px = x; py = y;
                    }
                    buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                }
                break;
            case Function::FUNC_TYPE_POLAR:
                {
                    std::vector<std::array<double, 2> > curr_line;
                    std::vector<double> vals;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    bool has_line = ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0);
                    bool is_ineq = (func.type & Function::FUNC_TYPE_MOD_INEQ) != 0;
                    bool is_ineq_less = (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) != 0;
                    if (is_ineq) {
                        vals.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    if (has_line) {
                        curr_line.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    for (double t = tmin; t <= tmax; t += POLAR_STEP_SIZE) {
                        env.vars[t_var] = t;
                        double r = func.expr(env);
                        if (is_ineq) vals.push_back(r);
                        if (has_line) {
                            double x = r * cos(t), y = r * sin(t);
                            curr_line.push_back({x, y});
                        }
                    }
                    if (has_line) {
                        buf_add_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f,
                                false, true, false);
                    }
                    if (is_ineq) {
                        const float INTERVAL = 1.5f;
                        double beg_mod = std::fmod(tmin, 2*M_PI);
                        double end_mod = std::fmod(tmax, 2*M_PI);
                        if (beg_mod < 0) beg_mod += 2 * M_PI;
                        if (end_mod < 0) end_mod += 2 * M_PI;
                        double t_start = tmin - beg_mod;
                        double t_end = tmax + (end_mod == 0.0 ? 0.0 : (2*M_PI - end_mod));
                        for (float sy = 0; sy < view.shigh; sy += INTERVAL) {
                            double y = _SY_TO_Y(sy);
                            for (float sx = 0; sx < view.swid; sx += INTERVAL) {
                                double x = _SX_TO_X(sx);
                                double theta_mod = std::atan2(y, x);
                                double r = std::sqrt(x*x + y*y);
                                if (theta_mod < 0) theta_mod += 2 * M_PI;
                                double alpha = 0.;
                                for (double t = t_start; t <= tmax + t_end; t += 2*M_PI) {
                                    double theta = t + theta_mod;
                                    if (theta < tmin || theta > tmax) continue;
                                    size_t near_idx = std::min((size_t)std::max(
                                                std::round((theta - tmin) / POLAR_STEP_SIZE), 0.),
                                                vals.size() - 1);
                                    double thresh_r = vals[near_idx];
                                    if (r < thresh_r == is_ineq_less) {
                                        alpha = 0.25 + 0.75 * alpha; // Simulate blend
                                    }
                                }
                                if (alpha > 0.) {
                                    color::color c = func.line_color;
                                    c.a = alpha;
                                    buf_add_screen_rectangle(draw_buf, view, sx, sy,
                                            INTERVAL, INTERVAL, true, c, 0.0f, funcid);
                                }
                            }
                        }
                    }
                }
                break;
            case Function::FUNC_TYPE_EXPLICIT:
                plot_explicit(funcid, false); break;
            case Function::FUNC_TYPE_EXPLICIT_Y:
                plot_explicit(funcid, true); break;

            // Geometry (other than polyline)
            case Function::FUNC_TYPE_GEOM_RECT:
                {
                    if (func.exprs.size() != 4) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = DrawBufferObject::RECT;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &b = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    b[0] = func.exprs[2](env);
                    b[1] = func.exprs[3](env);
                    if (b[0] < a[0]) std::swap(a[0], b[0]);
                    if (b[1] < a[1]) std::swap(a[1], b[1]);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = DrawBufferObject::FILLED_RECT;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_CIRCLE:
            case Function::FUNC_TYPE_GEOM_ELLIPSE:
                {
                    size_t is_ellipse = (ftype_nomod == Function::FUNC_TYPE_GEOM_ELLIPSE);
                    if (func.exprs.size() != 3 + is_ellipse) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = is_ellipse ? DrawBufferObject::ELLIPSE : DrawBufferObject::CIRCLE;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &right = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    right[0] = a[0] + func.exprs[2](env);
                    right[1] = a[1];
                    if (is_ellipse) right[1] += func.exprs[3](env);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = is_ellipse ? DrawBufferObject::FILLED_ELLIPSE :
                            DrawBufferObject::FILLED_CIRCLE;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_TEXT:
                {
                    if (func.exprs.size() != 2) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.type = DrawBufferObject::TEXT;
                    obj.points = { { func.exprs[0](env), func.exprs[1](env) } };
                    obj.str = func.str;
                    draw_buf.push_back(std::move(obj));
                }
                break;
            case Function::FUNC_TYPE_FRACTAL_MANDELBROT:
                {
                }
                break;
        }
    }
    // PROFILE(all);
    if (loss_detail) {
        func_error = "Warning: some detail may be lost";
    } else if (prev_loss_detail) {
        func_error.clear();
    }
}